

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O2

void __thiscall
SimpleBVH::BVH::init_boxes_recursive
          (BVH *this,
          vector<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
          *cornerlist,int node_index,int b,int e)

{
  int node_index_00;
  pointer paVar1;
  ulong uVar2;
  ulong uVar3;
  Scalar *pSVar4;
  Scalar *pSVar5;
  ulong uVar6;
  ulong uVar7;
  int c;
  long index;
  int e_00;
  double dVar8;
  
  if (e - b == 0) {
    __assert_fail("b != e",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                  ,0xb9,
                  "void SimpleBVH::BVH::init_boxes_recursive(const std::vector<std::array<VectorMax3d, 2>> &, int, int, int)"
                 );
  }
  uVar6 = (ulong)node_index;
  paVar1 = (this->boxlist).
           super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(this->boxlist).
                super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)paVar1 >> 6;
  if (uVar7 <= uVar6) {
    __assert_fail("node_index < boxlist.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                  ,0xba,
                  "void SimpleBVH::BVH::init_boxes_recursive(const std::vector<std::array<VectorMax3d, 2>> &, int, int, int)"
                 );
  }
  if (b + 1 == e) {
    std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator=
              (paVar1 + uVar6,
               (cornerlist->
               super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
               )._M_impl.super__Vector_impl_data._M_start + b);
  }
  else {
    uVar2 = (ulong)(node_index * 2);
    if (uVar7 <= uVar2) {
      __assert_fail("childl < boxlist.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                    ,0xc4,
                    "void SimpleBVH::BVH::init_boxes_recursive(const std::vector<std::array<VectorMax3d, 2>> &, int, int, int)"
                   );
    }
    node_index_00 = node_index * 2 + 1;
    uVar3 = (ulong)node_index_00;
    if (uVar7 <= uVar3) {
      __assert_fail("childr < boxlist.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                    ,0xc5,
                    "void SimpleBVH::BVH::init_boxes_recursive(const std::vector<std::array<VectorMax3d, 2>> &, int, int, int)"
                   );
    }
    e_00 = (e - b) / 2 + b;
    init_boxes_recursive(this,cornerlist,node_index * 2,b,e_00);
    init_boxes_recursive(this,cornerlist,node_index_00,e_00,e);
    uVar7 = (long)(this->boxlist).
                  super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->boxlist).
                  super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 6;
    if (uVar7 <= uVar2) {
      __assert_fail("childl < boxlist.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                    ,0xca,
                    "void SimpleBVH::BVH::init_boxes_recursive(const std::vector<std::array<VectorMax3d, 2>> &, int, int, int)"
                   );
    }
    if (uVar7 <= uVar3) {
      __assert_fail("childr < boxlist.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                    ,0xcb,
                    "void SimpleBVH::BVH::init_boxes_recursive(const std::vector<std::array<VectorMax3d, 2>> &, int, int, int)"
                   );
    }
    for (index = 0;
        index < *(Index *)((long)&((cornerlist->
                                   super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                  m_storage + 0x18); index = index + 1) {
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_1> *)
                          ((this->boxlist).
                           super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar2),index);
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_1> *)
                          ((this->boxlist).
                           super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar3),index);
      dVar8 = *pSVar5;
      if (*pSVar4 <= *pSVar5) {
        dVar8 = *pSVar4;
      }
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_1> *)
                          ((this->boxlist).
                           super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar6),index);
      *pSVar4 = dVar8;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_1> *)
                          ((this->boxlist).
                           super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar2]._M_elems + 1),index);
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_1> *)
                          ((this->boxlist).
                           super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar3]._M_elems + 1),index);
      dVar8 = *pSVar5;
      if (*pSVar5 <= *pSVar4) {
        dVar8 = *pSVar4;
      }
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_1> *)
                          ((this->boxlist).
                           super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_elems + 1),index);
      *pSVar4 = dVar8;
    }
  }
  return;
}

Assistant:

void BVH::init_boxes_recursive(
    const std::vector<std::array<VectorMax3d, 2>>& cornerlist,
    int node_index,
    int b,
    int e)
{
    assert(b != e);
    assert(node_index < boxlist.size());

    if (b + 1 == e) {
        boxlist[node_index] = cornerlist[b];
        return;
    }
    int m = b + (e - b) / 2;
    int childl = 2 * node_index;
    int childr = 2 * node_index + 1;

    assert(childl < boxlist.size());
    assert(childr < boxlist.size());

    init_boxes_recursive(cornerlist, childl, b, m);
    init_boxes_recursive(cornerlist, childr, m, e);

    assert(childl < boxlist.size());
    assert(childr < boxlist.size());
    for (int c = 0; c < cornerlist[0][0].size(); ++c) {
        boxlist[node_index][0][c] =
            std::min(boxlist[childl][0][c], boxlist[childr][0][c]);
        boxlist[node_index][1][c] =
            std::max(boxlist[childl][1][c], boxlist[childr][1][c]);
    }
}